

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

void __thiscall
axl::sl::ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_>::release
          (ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_> *this)

{
  if (this->m_hdr != (Hdr *)0x0) {
    rc::RefCount::release((RefCount *)this->m_hdr);
  }
  this->m_p = (SockAddr *)0x0;
  this->m_hdr = (Hdr *)0x0;
  this->m_count = 0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}